

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_<float,int,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  int *piVar1;
  ulong *puVar2;
  int iVar3;
  int iVar4;
  unsigned_long *puVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined4 uVar16;
  undefined1 auVar15 [16];
  double local_90;
  ulong local_88;
  undefined8 local_78;
  ulong local_58;
  
  lVar7 = (long)Xc_indptr[col_num];
  lVar8 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  piVar1 = Xc_ind + lVar8;
  iVar3 = piVar1[-1];
  puVar2 = ix_arr + end + 1;
  puVar5 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar2);
  local_58 = (end - st) + 1;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_88 = 0;
  local_90 = 0.0;
LAB_00244d6e:
LAB_00244d73:
  piVar6 = Xc_ind + lVar7;
  do {
    if (((puVar5 == puVar2) || (lVar7 == lVar8)) || ((ulong)(long)iVar3 < *puVar5)) {
LAB_00244ec2:
      dVar12 = (double)CONCAT44(local_78._4_4_,(undefined4)local_78);
      if (local_88 == 0) {
        *x_mean = 0.0;
        dVar12 = 0.0;
      }
      else {
        uVar16 = (undefined4)(local_58 >> 0x20);
        if (local_88 < local_58) {
          auVar9._8_4_ = (int)(local_88 >> 0x20);
          auVar9._0_8_ = local_88;
          auVar9._12_4_ = 0x45300000;
          dVar13 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_88) - 4503599627370496.0);
          auVar15._8_4_ = uVar16;
          auVar15._0_8_ = local_58;
          auVar15._12_4_ = 0x45300000;
          dVar10 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0);
          dVar12 = dVar13 / dVar10;
          local_90 = local_90 +
                     (1.0 - dVar12) * dVar13 *
                     (double)CONCAT44(local_78._4_4_,(undefined4)local_78) *
                     (double)CONCAT44(local_78._4_4_,(undefined4)local_78);
          dVar12 = (double)CONCAT44(local_78._4_4_,(undefined4)local_78) * dVar12;
        }
        else {
          auVar11._8_4_ = uVar16;
          auVar11._0_8_ = local_58;
          auVar11._12_4_ = 0x45300000;
          dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0);
        }
        *x_mean = dVar12;
        dVar12 = SQRT(local_90 / dVar10);
      }
      *x_sd = dVar12;
      return;
    }
    iVar4 = (int)*puVar5;
    if (*piVar6 == iVar4) {
      if ((uint)ABS(Xc[lVar7]) < 0x7f800000) {
        dVar10 = (double)Xc[lVar7];
        dVar12 = dVar10;
        if (local_88 != 0) {
          dVar12 = (double)CONCAT44(local_78._4_4_,(undefined4)local_78);
        }
        local_88 = local_88 + 1;
        auVar14._8_4_ = (int)(local_88 >> 0x20);
        auVar14._0_8_ = local_88;
        auVar14._12_4_ = 0x45300000;
        local_78 = (double)CONCAT44(local_78._4_4_,(undefined4)local_78) +
                   (dVar10 - (double)CONCAT44(local_78._4_4_,(undefined4)local_78)) /
                   ((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_88) - 4503599627370496.0));
        local_90 = fma(dVar10 - local_78,dVar10 - dVar12,local_90);
      }
      else {
        local_58 = local_58 - 1;
      }
      local_78._4_4_ = (undefined4)((ulong)local_78 >> 0x20);
      if ((puVar5 == ix_arr + end) || (lVar7 == lVar8 + -1)) goto LAB_00244ec2;
      puVar5 = puVar5 + 1;
      piVar6 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (piVar6 + 1,piVar1,puVar5);
      lVar7 = (long)piVar6 - (long)Xc_ind >> 2;
      goto LAB_00244d6e;
    }
    if (*piVar6 <= iVar4) break;
    puVar5 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar5 + 1,puVar2,piVar6);
  } while( true );
  piVar6 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (piVar6 + 1,piVar1,puVar5);
  lVar7 = (long)piVar6 - (long)Xc_ind >> 2;
  goto LAB_00244d73;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}